

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

void __thiscall
vkt::texture::anon_unknown_0::Texture2DShadowTestInstance::~Texture2DShadowTestInstance
          (Texture2DShadowTestInstance *this)

{
  ~Texture2DShadowTestInstance(this);
  operator_delete(this,0x288);
  return;
}

Assistant:

Texture2DShadowTestInstance::~Texture2DShadowTestInstance (void)
{
	m_textures.clear();
	m_cases.clear();
}